

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Am_Value offset_from_owner_procedure(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Constraint_Context *pAVar3;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar4;
  Am_Slot_Flags in_RSI;
  Am_Value AVar5;
  Key_Offset_Store_Data *store;
  Am_Object local_28;
  Am_Object owner;
  Am_Object *self_local;
  Am_Value *value;
  Am_Wrapper *this;
  
  owner.data._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  Am_Object::Get_Owner(&local_28,in_RSI);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar3 = Am_Object_Advanced::Get_Context();
    iVar2 = (*pAVar3->_vptr_Am_Constraint_Context[6])();
    this = (Am_Wrapper *)CONCAT44(extraout_var,iVar2);
    in_value = Am_Object::Get(&local_28,*(Am_Slot_Key *)&this->field_0xc,0);
    Am_Value::operator=((Am_Value *)self,in_value);
    Am_Wrapper::Release(this);
    modify_value((Am_Value *)self,*(int *)&this[1].super_Am_Registered_Type._vptr_Am_Registered_Type
                 ,*(float *)((long)&this[1].super_Am_Registered_Type._vptr_Am_Registered_Type + 4));
  }
  else {
    Am_Value::Set_Value_Type((Am_Value *)self,1);
  }
  owner.data._7_1_ = 1;
  Am_Object::~Am_Object(&local_28);
  aVar4 = extraout_RDX;
  if ((owner.data._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar4 = extraout_RDX_00;
  }
  AVar5.value.wrapper_value = aVar4.wrapper_value;
  AVar5._0_8_ = self;
  return AVar5;
}

Assistant:

static Am_Value
offset_from_owner_procedure(Am_Object &self)
{
  Am_Value value;
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Key_Offset_Store_Data *store =
        (Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
    value = owner.Get(store->key);
    store->Release();
    modify_value(value, store->offset, store->multiplier);
  } else
    value.Set_Value_Type(Am_ZERO); //not there, return a ZERO type
  return value;
}